

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O1

int __thiscall mbc::Val::PersonHandle::init(PersonHandle *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  istream *piVar3;
  size_type *extraout_RAX;
  size_type *psVar4;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  size_type *local_140;
  string name;
  string sex;
  string telephone;
  string location;
  string mail_number;
  string email;
  string qq_number;
  string classes;
  Input input;
  
  units::Input::Input((Input *)((long)&classes.field_2 + 8),(istream *)&std::cin,
                      (ostream *)&std::cout);
  local_140 = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  name.field_2._8_8_ = &sex._M_string_length;
  sex._M_dataplus._M_p = (pointer)0x0;
  sex._M_string_length._0_1_ = 0;
  sex.field_2._8_8_ = &telephone._M_string_length;
  telephone._M_dataplus._M_p = (pointer)0x0;
  telephone._M_string_length._0_1_ = 0;
  telephone.field_2._8_8_ = &location._M_string_length;
  location._M_dataplus._M_p = (pointer)0x0;
  location._M_string_length._0_1_ = 0;
  location.field_2._8_8_ = &mail_number._M_string_length;
  mail_number._M_dataplus._M_p = (pointer)0x0;
  mail_number._M_string_length._0_1_ = 0;
  mail_number.field_2._8_8_ = &email._M_string_length;
  email._M_dataplus._M_p = (pointer)0x0;
  email._M_string_length._0_1_ = 0;
  email.field_2._8_8_ = &qq_number._M_string_length;
  qq_number._M_dataplus._M_p = (pointer)0x0;
  qq_number._M_string_length._0_1_ = 0;
  qq_number.field_2._8_8_ = &classes._M_string_length;
  classes._M_dataplus._M_p = (pointer)0x0;
  classes._M_string_length._0_1_ = 0;
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460," | please enter name","");
  piVar3 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_460);
  std::operator>>(piVar3,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p);
  }
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_440," | please enter sex [M/F]","");
  piVar3 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_440);
  std::operator>>(piVar3,(string *)(name.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_420," | please enter telephone [only include digit]","");
  piVar3 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_420);
  std::operator>>(piVar3,(string *)(sex.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p);
  }
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_400," | please enter location","");
  piVar3 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_400);
  std::operator>>(piVar3,(string *)(telephone.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0," | please enter postal number [6-length number]","");
  piVar3 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_3e0);
  std::operator>>(piVar3,(string *)(location.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p);
  }
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0," | please enter email","");
  piVar3 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_3c0);
  std::operator>>(piVar3,(string *)(mail_number.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a0," | please enter qq number","");
  piVar3 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_3a0);
  std::operator>>(piVar3,(string *)(email.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380," | please enter classes","")
  ;
  units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  std::ws<char,std::char_traits<char>>((istream *)&std::cin);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x40);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)(qq_number.field_2._M_local_buf + 8),cVar1);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360," | ","");
  units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"name","");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_140,name._M_dataplus._M_p + (long)local_140);
  changeAttr(this,&local_2c0,&local_2a0);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"sex","");
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,name.field_2._8_8_,sex._M_dataplus._M_p + name.field_2._8_8_);
  changeAttr(this,&local_280,&local_260);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"telephone","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,sex.field_2._8_8_,telephone._M_dataplus._M_p + sex.field_2._8_8_);
  changeAttr(this,&local_240,&local_220);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"location","");
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,telephone.field_2._8_8_,
             location._M_dataplus._M_p + telephone.field_2._8_8_);
  changeAttr(this,&local_200,&local_1e0);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"mail_number","");
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,location.field_2._8_8_,
             mail_number._M_dataplus._M_p + location.field_2._8_8_);
  changeAttr(this,&local_1c0,&local_1a0);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"email","");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,mail_number.field_2._8_8_,
             email._M_dataplus._M_p + mail_number.field_2._8_8_);
  changeAttr(this,&local_340,&local_320);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"qq_number","");
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,email.field_2._8_8_,
             qq_number._M_dataplus._M_p + email.field_2._8_8_);
  changeAttr(this,&local_180,&local_160);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"classes","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e0,qq_number.field_2._8_8_,
             classes._M_dataplus._M_p + qq_number.field_2._8_8_);
  changeAttr(this,&local_300,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if ((size_type *)qq_number.field_2._8_8_ != &classes._M_string_length) {
    operator_delete((void *)qq_number.field_2._8_8_);
  }
  if ((size_type *)email.field_2._8_8_ != &qq_number._M_string_length) {
    operator_delete((void *)email.field_2._8_8_);
  }
  if ((size_type *)mail_number.field_2._8_8_ != &email._M_string_length) {
    operator_delete((void *)mail_number.field_2._8_8_);
  }
  if ((size_type *)location.field_2._8_8_ != &mail_number._M_string_length) {
    operator_delete((void *)location.field_2._8_8_);
  }
  if ((size_type *)telephone.field_2._8_8_ != &location._M_string_length) {
    operator_delete((void *)telephone.field_2._8_8_);
  }
  psVar4 = &telephone._M_string_length;
  if ((size_type *)sex.field_2._8_8_ != psVar4) {
    operator_delete((void *)sex.field_2._8_8_);
    psVar4 = extraout_RAX;
  }
  iVar2 = (int)psVar4;
  if ((size_type *)name.field_2._8_8_ != &sex._M_string_length) {
    operator_delete((void *)name.field_2._8_8_);
    iVar2 = extraout_EAX;
  }
  if (local_140 != &name._M_string_length) {
    operator_delete(local_140);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void PersonHandle::init() {
    units::Input input(std::cin, std::cout);
    string name, sex, telephone, location, mail_number, email, qq_number, classes;

    input(" | please enter name") >> name;
    input(" | please enter sex [M/F]") >> sex;;
    input(" | please enter telephone [only include digit]") >> telephone;
    input(" | please enter location") >> location;
    input(" | please enter postal number [6-length number]") >> mail_number;
    input(" | please enter email") >> email;
    input(" | please enter qq number") >> qq_number;
    input(" | please enter classes");
    std::cin >> std::ws;
    std::getline(std::cin, classes);
    input(" | ");

    (*this)
        .changeAttr("name", name)
        .changeAttr("sex",  sex)
        .changeAttr("telephone", telephone)
        .changeAttr("location", location)
        .changeAttr("mail_number", mail_number)
        .changeAttr("email", email)
        .changeAttr("qq_number", qq_number)
        .changeAttr("classes", classes)
    ;

    return;
}